

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall t_rb_generator::generate_const(t_rb_generator *this,t_const *tconst)

{
  t_rb_ofstream *out;
  t_type *type;
  pointer pcVar1;
  t_const_value *value;
  char *pcVar2;
  int iVar3;
  ostream *poVar4;
  string name;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  type = tconst->type_;
  local_50 = local_40;
  pcVar1 = (tconst->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (tconst->name_)._M_string_length);
  pcVar2 = local_50;
  value = tconst->value_;
  iVar3 = toupper((int)*local_50);
  *pcVar2 = (char)iVar3;
  out = &this->f_consts_;
  if (0 < *(int *)&(this->f_consts_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(this->f_consts_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  render_const_value(this,out,type,value);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void t_rb_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  name[0] = toupper(name[0]);

  f_consts_.indent() << name << " = ";
  render_const_value(f_consts_, type, value) << endl << endl;
}